

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::Material
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string local_150;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_130;
  long local_128;
  memory_resource local_120 [2];
  string local_110;
  ParameterDictionary local_f0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_88;
  
  local_130.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_88,in_RDX,&local_130);
  ParameterDictionary::ParameterDictionary(&local_f0,&local_88,RGBColorSpace::sRGB);
  local_88.nStored = 0;
  (*(local_88.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_88.alloc.memoryResource,local_88.ptr,local_88.nAlloc << 3,8);
  if (this->upgrade == true) {
    ParameterDictionary::RenameUsedTextures(&local_f0,&this->definedTextures);
  }
  local_128 = 0;
  local_120[0]._vptr_memory_resource._0_1_ = 0;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_130.memoryResource = local_120;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + name->_M_string_length);
  if (this->upgrade == true) {
    upgradeMaterial(&local_150,this,&local_110,&local_f0,params._0_24_);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct
            ((ulong)&local_150,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,std::__cxx11::string&>("%sMaterial \"%s\"\n",&local_150,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_130.memoryResource,local_128);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_150,&local_f0,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_130.memoryResource != local_120) {
    operator_delete(local_130.memoryResource,
                    CONCAT71(local_120[0]._vptr_memory_resource._1_7_,
                             local_120[0]._vptr_memory_resource._0_1_) + 1);
  }
  local_f0.params.nStored = 0;
  (*(local_f0.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_f0.params.alloc.memoryResource,local_f0.params.ptr,local_f0.params.nAlloc << 3,8)
  ;
  return;
}

Assistant:

void FormattingScene::Material(const std::string &name, ParsedParameterVector params,
                               FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    std::string newName = name;
    if (upgrade)
        extra = upgradeMaterial(&newName, &dict, loc);

#if 0
    // Hack for landscape upgrade
    if (upgrade && name == "mix") {
        ParameterDictionary dict(params, RGBColorSpace::sRGB);
        const ParameterDictionary &d1 = namedMaterialDictionaries[dict.GetOneString("namedmaterial1", "")];
        const ParameterDictionary &d2 = namedMaterialDictionaries[dict.GetOneString("namedmaterial2", "")];

        if (!d1.GetTexture("reflectance").empty() &&
            !d2.GetTexture("transmittance").empty()) {
            Printf("%sMaterial \"diffusetransmission\"\n", indent());
            Printf("%s\"texture reflectance\" \"%s\"\n", indent(1), d1.GetTexture("reflectance"));
            Printf("%s\"texture transmittance\" \"%s\"\n", indent(1), d2.GetTexture("transmittance"));

            if (!d1.GetTexture("displacement").empty())
                Printf("%s\"texture displacement\" \"%s\"\n", indent(1), d1.GetTexture("displacement"));
            else if (!d2.GetTexture("displacement").empty())
                Printf("%s\"texture displacement\" \"%s\"\n", indent(1), d2.GetTexture("displacement"));

            Printf("%s\"float scale\" 0.5\n", indent(1));

            return;
        }
    }
#endif

    Printf("%sMaterial \"%s\"\n", indent(), newName);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}